

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

double baryonyx::itm::compute_delta<double,baryonyx::itm::default_cost_type<double>>
                 (context *ctx,default_cost_type<double> *c,double theta,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  double ret;
  double mini;
  double local_38;
  double local_30;
  double local_28;
  undefined1 extraout_var [56];
  
  local_28 = theta;
  info<>(ctx,"  - delta not defined, compute it:\n");
  auVar2._0_8_ = default_cost_type<double>::min(c,n);
  auVar2._8_56_ = extraout_var;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = theta;
  auVar1 = vfnmadd132sd_fma(auVar2._0_16_,auVar2._0_16_,auVar1);
  local_38 = auVar1._0_8_;
  local_30 = auVar2._0_8_;
  info<double,double,double>
            (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_38,&local_30,
             &local_28);
  return local_38;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}